

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::Anytest_TreatAsSet_Test::TestBody(Anytest_TreatAsSet_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Any *pAVar2;
  FieldDescriptor *field;
  char *in_R9;
  TestAny m1;
  TestAny m2;
  MessageDifferencer message_differencer;
  AssertHelper AStack_348;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_340;
  string local_338;
  internal local_318 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  undefined1 local_308 [72];
  TestField local_2c0;
  TestField local_268;
  undefined1 local_210 [72];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestField::TestField(&local_268,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_2c0,(Arena *)0x0);
  local_268.field_0._60_8_ = 0x1e00000014;
  local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xc;
  local_2c0.field_0._60_8_ = 0x1f00000014;
  local_2c0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2c0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xc;
  proto2_unittest::TestAny::TestAny((TestAny *)local_308,(Arena *)0x0);
  proto2_unittest::TestAny::TestAny((TestAny *)local_210,(Arena *)0x0);
  pAVar2 = (Any *)protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            ((RepeatedPtrFieldBase *)(local_308 + 0x18),
                             Arena::DefaultConstruct<google::protobuf::Any>);
  Any::PackFrom(pAVar2,&local_268.super_Message);
  pAVar2 = (Any *)protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            ((RepeatedPtrFieldBase *)(local_308 + 0x18),
                             Arena::DefaultConstruct<google::protobuf::Any>);
  Any::PackFrom(pAVar2,&local_2c0.super_Message);
  pAVar2 = (Any *)protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            ((RepeatedPtrFieldBase *)(local_210 + 0x18),
                             Arena::DefaultConstruct<google::protobuf::Any>);
  Any::PackFrom(pAVar2,&local_2c0.super_Message);
  pAVar2 = (Any *)protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            ((RepeatedPtrFieldBase *)(local_210 + 0x18),
                             Arena::DefaultConstruct<google::protobuf::Any>);
  Any::PackFrom(pAVar2,&local_268.super_Message);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  paVar1 = &local_338.field_2;
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"repeated_any_value","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_308,(Message *)local_338._M_dataplus._M_p,
                             (string *)local_338._M_string_length);
  util::MessageDifferencer::TreatAsSet(&local_1c8,field);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  local_318[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c8,(Message *)local_308,(Message *)local_210);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_318[0]) {
    testing::Message::Message((Message *)&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_338,local_318,(AssertionResult *)"message_differencer.Compare(m1, m2)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10dd,local_338._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if (local_340._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_340._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestAny::~TestAny((TestAny *)local_210);
  proto2_unittest::TestAny::~TestAny((TestAny *)local_308);
  proto2_unittest::TestField::~TestField(&local_2c0);
  proto2_unittest::TestField::~TestField(&local_268);
  return;
}

Assistant:

TEST(Anytest, TreatAsSet) {
  proto2_unittest::TestField value1, value2;
  value1.set_a(20);
  value1.set_b(30);
  value2.set_a(20);
  value2.set_b(31);

  proto2_unittest::TestAny m1, m2;
  m1.add_repeated_any_value()->PackFrom(value1);
  m1.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value1);

  util::MessageDifferencer message_differencer;
  message_differencer.TreatAsSet(GetFieldDescriptor(m1, "repeated_any_value"));
  EXPECT_TRUE(message_differencer.Compare(m1, m2));
}